

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

char * TadsServerManager::gen_rand_id(void *obj)

{
  tm *data;
  char *pcVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  long systime;
  time_t timer;
  void *obj_local;
  uchar hval [32];
  sha256_ctx s;
  uchar rbuf [128];
  
  obj_local = obj;
  sha256_begin(&s);
  timer = time((time_t *)0x0);
  data = localtime(&timer);
  sha256_hash((uchar *)data,0x38,&s);
  systime = os_get_sys_clock_ms();
  sha256_hash((uchar *)&systime,8,&s);
  sha256_hash((uchar *)obj,8,&s);
  sha256_hash((uchar *)&obj_local,8,&s);
  os_gen_rand_bytes(rbuf,0x80);
  sha256_hash(rbuf,0x80,&s);
  sha256_end(hval,&s);
  pcVar1 = lib_alloc_str(0x20);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
    bVar2 = hval[lVar4] & 0xf;
    cVar3 = bVar2 + 0x57;
    if (bVar2 < 10) {
      cVar3 = bVar2 + 0x30;
    }
    pcVar1[lVar4] = cVar3;
  }
  pcVar1[0x20] = '\0';
  return pcVar1;
}

Assistant:

char *TadsServerManager::gen_rand_id(void *obj)
{
    /* set up a hashing buffer */
    sha256_ctx s;
    sha256_begin(&s);

    /* add the current date/time to the hash */
    os_time_t timer = os_time(0);
    struct tm *tblock = os_localtime(&timer);
    sha256_hash((unsigned char *)tblock, sizeof(*tblock), &s);

    /* add the system timer to the hash */
    long systime = os_get_sys_clock_ms();
    sha256_hash((unsigned char *)&systime, sizeof(systime), &s);

    /* add the object address to the hash */
    sha256_hash((unsigned char *)obj, sizeof(obj), &s);

    /* add the current stack location to the hash */
    sha256_hash((unsigned char *)&obj, sizeof(void *), &s);

    /* add some random bytes from the operating system */
    unsigned char rbuf[128];
    os_gen_rand_bytes(rbuf, sizeof(rbuf));
    sha256_hash(rbuf, sizeof(rbuf), &s);

    /* compute the hash */
    unsigned char hval[32];
    sha256_end(hval, &s);

    /* convert it to hex, but just keep the low nybbles, for 32 digits */
    char *ret = lib_alloc_str(32);
    int i;
    for (i = 0 ; i < 32 ; ++i)
        ret[i] = nybble2hex(hval[i]);

    /* null-terminate the string */
    ret[i] = '\0';

    /* return the allocated string */
    return ret;
}